

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::BufferData::exec(BufferData *this,Thread *t)

{
  GLenum *t_00;
  deUint32 dVar1;
  Thread *this_00;
  deUint8 *pdVar2;
  MessageBuilder *pMVar3;
  undefined1 local_1c0 [400];
  
  this_00 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (this_00 != (Thread *)0x0) {
    pdVar2 = tcu::ThreadUtil::Thread::getDummyData(this_00,this->m_size);
    local_1c0._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glBindBuffer(");
    t_00 = &this->m_target;
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<((MessageBuilder *)local_1c0,t_00);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&((this->m_buffer).m_ptr)->buffer);
    std::operator<<((ostream *)&pMVar3->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x40))
              (this->m_target,((this->m_buffer).m_ptr)->buffer);
    dVar1 = (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar1,"bindBuffer(m_target, m_buffer->buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4ed);
    local_1c0._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"End -- glBindBuffer()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    local_1c0._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glBufferData(");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<((MessageBuilder *)local_1c0,t_00);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_size);
    std::operator<<((ostream *)&pMVar3->field_0x18,", <DATA>, ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_usage);
    std::operator<<((ostream *)&pMVar3->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x150))
              (*t_00,this->m_size,pdVar2,this->m_usage);
    dVar1 = (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar1,"bufferData(m_target, m_size, dummyData, m_usage)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4f1);
    local_1c0._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"End -- glBufferData()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    local_1c0._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glBindBuffer(");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<((MessageBuilder *)local_1c0,t_00);
    std::operator<<((ostream *)&pMVar3->field_0x18,", 0)");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x40))(*t_00,0);
    dVar1 = (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar1,"bindBuffer(m_target, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4f5);
    local_1c0._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"End -- glBindBuffer()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void BufferData::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	void* dummyData = thread.getDummyData(m_size);

	thread.newMessage() << "Begin -- glBindBuffer(" << m_target << ", " << m_buffer->buffer << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(m_target, m_buffer->buffer));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBufferData(" << m_target << ", " << m_size << ", <DATA>, " << m_usage << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bufferData(m_target, m_size, dummyData, m_usage));
	thread.newMessage() << "End -- glBufferData()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(" << m_target << ", 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(m_target, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;
}